

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase199::run(TestCase199 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  bool bVar7;
  Fault f;
  MockExceptionCallback mockCallback;
  int i;
  char *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  ExceptionCallback local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined4 local_2a8;
  int local_294;
  char *local_290 [41];
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ExceptionCallback::ExceptionCallback(&local_2d8);
  local_2d8._vptr_ExceptionCallback = (_func_int **)&PTR__MockExceptionCallback_001b9420;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  local_2a8 = 0xffffffff;
  if (Debug::minSeverity < 2) {
    Debug::log<char_const(&)[13]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xcb,WARNING,"\"Hello world!\"",(char (*) [13])"Hello world!");
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_318,&local_68,0xcb);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x192309);
  paVar1 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_2f8._M_dataplus._M_p == psVar6) {
    local_2f8.field_2._M_allocated_capacity = *psVar6;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar6;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
  paVar2 = &local_338.field_2;
  local_338._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
    local_338.field_2._M_allocated_capacity = *psVar6;
    local_338.field_2._8_8_ = plVar5[3];
    local_338._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar6;
  }
  _Var3._M_p = local_338._M_dataplus._M_p;
  local_338._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_338._M_string_length == local_2c8._M_string_length) {
    if (local_338._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(local_338._M_dataplus._M_p,local_2c8._M_dataplus._M_p,local_338._M_string_length)
      ;
      bVar7 = iVar4 != 0;
    }
  }
  else {
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar2) {
    operator_delete(_Var3._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((bool)(bVar7 & Debug::minSeverity < 3)) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_318,&local_88,0xcb);
    ::std::operator+(&local_2f8,"log message: ",&local_318);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
    local_338._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338.field_2._8_8_ = plVar5[3];
      local_338._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar6;
    }
    local_338._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Debug::log<char_const(&)[216],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: warning: Hello world!\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\", mockCallback.text"
               ,(char (*) [216])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\") == (mockCallback.text)"
               ,&local_338,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  local_2c8._M_string_length = 0;
  *local_2c8._M_dataplus._M_p = '\0';
  local_294 = 0x7b;
  local_290[0] = "foo";
  if (Debug::minSeverity < 3) {
    Debug::log<int&,char_const*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd3,ERROR,"i, str",&local_294,local_290);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_318,&local_a8,0xd3);
  ::std::operator+(&local_2f8,"log message: ",&local_318);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
  local_338._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
    local_338.field_2._M_allocated_capacity = *psVar6;
    local_338.field_2._8_8_ = plVar5[3];
    local_338._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar6;
  }
  _Var3._M_p = local_338._M_dataplus._M_p;
  local_338._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_338._M_string_length == local_2c8._M_string_length) {
    if (local_338._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(local_338._M_dataplus._M_p,local_2c8._M_dataplus._M_p,local_338._M_string_length)
      ;
      bVar7 = iVar4 != 0;
    }
  }
  else {
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar2) {
    operator_delete(_Var3._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((bool)(bVar7 & Debug::minSeverity < 3)) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_318,&local_c8,0xd3);
    ::std::operator+(&local_2f8,"log message: ",&local_318);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
    local_338._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338.field_2._8_8_ = plVar5[3];
      local_338._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar6;
    }
    local_338._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Debug::log<char_const(&)[220],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: error: i = 123; str = foo\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\", mockCallback.text"
               ,(char (*) [220])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\") == (mockCallback.text)"
               ,&local_338,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_2c8._M_string_length = 0;
  *local_2c8._M_dataplus._M_p = '\0';
  if (Debug::minSeverity < 5) {
    Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd8,DBG,"\"Some debug text.\"",(char (*) [17])"Some debug text.");
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_318,&local_e8,0xd8);
  ::std::operator+(&local_2f8,"log message: ",&local_318);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
  local_338._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
    local_338.field_2._M_allocated_capacity = *psVar6;
    local_338.field_2._8_8_ = plVar5[3];
    local_338._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar6;
  }
  _Var3._M_p = local_338._M_dataplus._M_p;
  local_338._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_338._M_string_length == local_2c8._M_string_length) {
    if (local_338._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(local_338._M_dataplus._M_p,local_2c8._M_dataplus._M_p,local_338._M_string_length)
      ;
      bVar7 = iVar4 != 0;
    }
  }
  else {
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar2) {
    operator_delete(_Var3._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((bool)(bVar7 & Debug::minSeverity < 3)) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_318,&local_108,0xd8);
    ::std::operator+(&local_2f8,"log message: ",&local_318);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
    local_338._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338.field_2._8_8_ = plVar5[3];
      local_338._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar6;
    }
    local_338._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Debug::log<char_const(&)[218],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: debug: Some debug text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\", mockCallback.text"
               ,(char (*) [218])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\") == (mockCallback.text)"
               ,&local_338,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  local_2c8._M_string_length = 0;
  *local_2c8._M_dataplus._M_p = '\0';
  if (Debug::minSeverity < 1) {
    Debug::log<char_const(&)[6]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xde,INFO,"\"Info.\"",(char (*) [6])"Info.");
  }
  iVar4 = ::std::__cxx11::string::compare((char *)&local_2c8);
  if ((iVar4 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[45],char_const(&)[1],std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (mockCallback.text)\", \"\", mockCallback.text"
               ,(char (*) [45])"failed: expected (\"\") == (mockCallback.text)",
               (char (*) [1])0x199111,&local_2c8);
  }
  local_2c8._M_string_length = 0;
  *local_2c8._M_dataplus._M_p = '\0';
  Debug::minSeverity = 0;
  Debug::log<char_const(&)[11]>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,0xe4,INFO,"\"Some text.\"",(char (*) [11])"Some text.");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,"");
  fileLine(&local_318,&local_128,0xe4);
  ::std::operator+(&local_2f8,"log message: ",&local_318);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
  local_338._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
    local_338.field_2._M_allocated_capacity = *psVar6;
    local_338.field_2._8_8_ = plVar5[3];
    local_338._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar6;
  }
  _Var3._M_p = local_338._M_dataplus._M_p;
  local_338._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_338._M_string_length == local_2c8._M_string_length) {
    if (local_338._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(local_338._M_dataplus._M_p,local_2c8._M_dataplus._M_p,local_338._M_string_length)
      ;
      bVar7 = iVar4 != 0;
    }
  }
  else {
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar2) {
    operator_delete(_Var3._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((bool)(bVar7 & Debug::minSeverity < 3)) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,"");
    fileLine(&local_318,&local_148,0xe4);
    ::std::operator+(&local_2f8,"log message: ",&local_318);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2f8);
    local_338._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_338._M_dataplus._M_p == psVar6) {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338.field_2._8_8_ = plVar5[3];
      local_338._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar6;
    }
    local_338._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Debug::log<char_const(&)[211],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xe6,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: info: Some text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\", mockCallback.text"
               ,(char (*) [211])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\") == (mockCallback.text)"
               ,&local_338,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  local_2c8._M_string_length = 0;
  *local_2c8._M_dataplus._M_p = '\0';
  Debug::minSeverity = 1;
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_48 = 0;
  uStack_40 = 0;
  Debug::Fault::init((Fault *)&local_338,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                    );
  Debug::Fault::fatal((Fault *)&local_338);
}

Assistant:

TEST(Debug, Log) {
  MockExceptionCallback mockCallback;
  int line;

  KJ_LOG(WARNING, "Hello world!"); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: warning: Hello world!\n",
            mockCallback.text);
  mockCallback.text.clear();

  int i = 123;
  const char* str = "foo";

  KJ_LOG(ERROR, i, str); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: error: i = 123; str = foo\n",
            mockCallback.text);
  mockCallback.text.clear();

  KJ_DBG("Some debug text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: debug: Some debug text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // INFO logging is disabled by default.
  KJ_LOG(INFO, "Info."); line = __LINE__;
  EXPECT_EQ("", mockCallback.text);
  mockCallback.text.clear();

  // Enable it.
  Debug::setLogLevel(Debug::Severity::INFO);
  KJ_LOG(INFO, "Some text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: info: Some text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // Back to default.
  Debug::setLogLevel(Debug::Severity::WARNING);

  KJ_ASSERT(1 == 1);
  EXPECT_FATAL(KJ_ASSERT(1 == 2)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2\n", mockCallback.text);
  mockCallback.text.clear();

  KJ_ASSERT(1 == 1) {
    ADD_FAILURE() << "Shouldn't call recovery code when check passes.";
    break;
  };

  bool recovered = false;
  KJ_ASSERT(1 == 2, "1 is not 2") { recovered = true; break; } line = __LINE__;
  EXPECT_EQ("recoverable exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; 1 is not 2\n", mockCallback.text);
  EXPECT_TRUE(recovered);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_ASSERT(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_REQUIRE(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_FAIL_ASSERT("foo")); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: foo\n",
            mockCallback.text);
  mockCallback.text.clear();
}